

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall TimerHeap::handleTimeout(TimerHeap *this)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint64_t uVar3;
  long lVar4;
  bool bVar5;
  ssize_t sVar6;
  Logger local_1038;
  undefined1 local_58 [8];
  timespec tv;
  uint64_t one;
  timeType_ now;
  
  sVar6 = read(this->timerfd_,&tv.tv_nsec,8);
  if (sVar6 != 8) {
    Logger::Logger(&local_1038,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                   ,0x77);
    if (0xd < ((int)&local_1038 + 0xfa8) - (int)local_1038.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_1038.impl_.stream_.buffer_.cur_,"Timeout Error",0xd);
      local_1038.impl_.stream_.buffer_.cur_ = local_1038.impl_.stream_.buffer_.cur_ + 0xd;
    }
    Logger::~Logger(&local_1038);
  }
  clock_gettime(1,(timespec *)local_58);
  one = (uint64_t)local_58;
  now.sec = tv.tv_sec / 1000000;
  do {
    psVar1 = (this->timerHeap_).
             super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (psVar1 == (this->timerHeap_).
                  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
    peVar2 = (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar1->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (peVar2->heapIndex_ == -1) {
LAB_0010d4a4:
      pop(this,0);
      bVar5 = true;
    }
    else {
      uVar3 = (peVar2->timeout_).sec;
      lVar4 = (peVar2->timeout_).msec;
      if (((long)one < (long)uVar3) || ((one == uVar3 && (now.sec < lVar4)))) {
        local_1038.impl_.stream_._0_8_ = uVar3;
        local_1038.impl_.stream_.buffer_.data_._0_8_ = lVar4;
        bVar5 = setTime(this,(timeType_ *)&one,(timeType_ *)&local_1038);
        if (!bVar5) goto LAB_0010d4a4;
        bVar5 = false;
      }
      else {
        pop(this,0);
        Logger::Logger(&local_1038,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                       ,0x83);
        if (0x13 < ((int)&local_1038 + 0xfa8) - (int)local_1038.impl_.stream_.buffer_.cur_) {
          builtin_strncpy(local_1038.impl_.stream_.buffer_.cur_,"Connection Timeout!",0x13);
          local_1038.impl_.stream_.buffer_.cur_ = local_1038.impl_.stream_.buffer_.cur_ + 0x13;
        }
        Logger::~Logger(&local_1038);
        bVar5 = true;
        if ((peVar2->callBack_).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(peVar2->callBack_)._M_invoker)((_Any_data *)&peVar2->callBack_);
        }
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  } while (bVar5);
  if ((this->timerHeap_).
      super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->timerHeap_).
      super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1038.impl_.stream_._0_8_ = 0;
    local_1038.impl_.stream_.buffer_.data_[0] = '\0';
    local_1038.impl_.stream_.buffer_.data_[1] = '\0';
    local_1038.impl_.stream_.buffer_.data_[2] = '\0';
    local_1038.impl_.stream_.buffer_.data_[3] = '\0';
    local_1038.impl_.stream_.buffer_.data_[4] = '\0';
    local_1038.impl_.stream_.buffer_.data_[5] = '\0';
    local_1038.impl_.stream_.buffer_.data_[6] = '\0';
    local_1038.impl_.stream_.buffer_.data_[7] = '\0';
    setTime(this,(timeType_ *)&one,(timeType_ *)&local_1038);
  }
  return;
}

Assistant:

void TimerHeap::handleTimeout() {
    uint64_t one;
    ssize_t size = read(timerfd_, &one, sizeof one);
    if (size != sizeof(uint64_t)) {
        LOG << "Timeout Error";
    }
    struct timespec tv;
    clock_gettime(CLOCK_MONOTONIC, &tv);
    Timer::timeType_ now = {tv.tv_sec, tv.tv_nsec / 1000 / 1000};
    while (!timerHeap_.empty()) {
        TimerPtr tnow = timerHeap_.front();
        if (tnow->isDeleted()) {
            pop(0);
//            LOG <<"delete";
        } else if (now >= tnow->getTimeout()) {
            pop(0);
            LOG << "Connection Timeout!";
            tnow->runCallBack();
        } else {
            if (setTime(now, tnow->getTimeout())) {
                break;
            } else {
                pop(0);
            }
        }
    }
    if (timerHeap_.empty()) setTime(now, {0, 0});
}